

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLogging.cpp
# Opt level: O1

void Jinx::Impl::LogWriteLine(LogLevel level,char *format,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unique_lock<std::mutex> lock;
  va_list argptr;
  char buffer [4096];
  LogLevel local_1104;
  char *local_1100;
  unique_lock<std::mutex> local_10f8;
  undefined8 local_10e8;
  undefined1 *local_10e0;
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined8 local_10b8;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  undefined8 local_1028;
  char local_1018 [4096];
  
  if (in_AL != '\0') {
    local_1098 = in_XMM0_Qa;
    local_1088 = in_XMM1_Qa;
    local_1078 = in_XMM2_Qa;
    local_1068 = in_XMM3_Qa;
    local_1058 = in_XMM4_Qa;
    local_1048 = in_XMM5_Qa;
    local_1038 = in_XMM6_Qa;
    local_1028 = in_XMM7_Qa;
  }
  local_10f8._M_device = &Log::logMutex;
  local_10f8._M_owns = false;
  local_10b8 = in_RDX;
  local_10b0 = in_RCX;
  local_10a8 = in_R8;
  local_10a0 = in_R9;
  std::unique_lock<std::mutex>::lock(&local_10f8);
  local_10f8._M_owns = true;
  if (Log::enableLogging == true) {
    local_10d8 = local_10c8;
    local_10e0 = &stack0x00000008;
    local_10e8 = 0x3000000010;
    vsnprintf(local_1018,0x1000,format,&local_10e8);
    sVar1 = strlen(local_1018);
    if (sVar1 < 0xffe) {
      (local_1018 + sVar1)[0] = '\n';
      (local_1018 + sVar1)[1] = '\0';
    }
    local_1104 = level;
    local_1100 = local_1018;
    if (Log::logFn.super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*Log::logFn._M_invoker)((_Any_data *)&Log::logFn,&local_1104,&local_1100);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_10f8);
  return;
}

Assistant:

inline_t void LogWriteLine(LogLevel level, const char * format, ...)
	{
		std::unique_lock<std::mutex> lock(Log::logMutex);
		if (!Log::enableLogging)
			return;
		va_list argptr;
		va_start(argptr, format);
		char buffer[BufferSize];
#if defined(JINX_WINDOWS)
		_vsnprintf_s(buffer, BufferSize, _TRUNCATE, format, argptr);
#else
		vsnprintf(buffer, BufferSize, format, argptr);
#endif
		size_t len = strlen(buffer);
		if (len < BufferSize - 2)
		{
			buffer[len] = '\n';
			buffer[len + 1] = 0;
		}
		Log::logFn(level, buffer);
		va_end(argptr);
	}